

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::
unordered_flat_set<std::basic_string_view<char,std::char_traits<char>>,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::insert<std::basic_string_view<char,std::char_traits<char>>const*>
          (unordered_flat_set<std::basic_string_view<char,std::char_traits<char>>,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
           *this,basic_string_view<char,_std::char_traits<char>_> *first,
          basic_string_view<char,_std::char_traits<char>_> *last)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  uint64_t hash;
  long lVar10;
  ulong uVar11;
  ulong pos0;
  ulong uVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  locator local_48;
  
  do {
    if (first == last) {
      return;
    }
    hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this,
                      first);
    pos0 = hash >> ((byte)*this & 0x3f);
    lVar10 = (hash & 0xff) * 4;
    cVar4 = (&UNK_007e24cc)[lVar10];
    cVar5 = (&UNK_007e24cd)[lVar10];
    cVar6 = (&UNK_007e24ce)[lVar10];
    bVar7 = (&UNK_007e24cf)[lVar10];
    uVar12 = 0;
    uVar11 = pos0;
    do {
      lVar10 = *(long *)(this + 0x10);
      pcVar1 = (char *)(lVar10 + uVar11 * 0x10);
      bVar13 = pcVar1[0xf];
      auVar14[0] = -(*pcVar1 == cVar4);
      auVar14[1] = -(pcVar1[1] == cVar5);
      auVar14[2] = -(pcVar1[2] == cVar6);
      auVar14[3] = -(pcVar1[3] == bVar7);
      auVar14[4] = -(pcVar1[4] == cVar4);
      auVar14[5] = -(pcVar1[5] == cVar5);
      auVar14[6] = -(pcVar1[6] == cVar6);
      auVar14[7] = -(pcVar1[7] == bVar7);
      auVar14[8] = -(pcVar1[8] == cVar4);
      auVar14[9] = -(pcVar1[9] == cVar5);
      auVar14[10] = -(pcVar1[10] == cVar6);
      auVar14[0xb] = -(pcVar1[0xb] == bVar7);
      auVar14[0xc] = -(pcVar1[0xc] == cVar4);
      auVar14[0xd] = -(pcVar1[0xd] == cVar5);
      auVar14[0xe] = -(pcVar1[0xe] == cVar6);
      auVar14[0xf] = -(bVar13 == bVar7);
      uVar9 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      if (uVar9 != 0) {
        lVar2 = *(long *)(this + 0x18);
        do {
          iVar3 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
            }
          }
          bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             this,first,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             ((ulong)(uint)(iVar3 << 4) + lVar2 + uVar11 * 0xf0));
          if (bVar8) goto LAB_00543bce;
          uVar9 = uVar9 - 1 & uVar9;
        } while (uVar9 != 0);
        bVar13 = *(byte *)(lVar10 + uVar11 * 0x10 + 0xf);
      }
      if (((&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar13) == 0) break;
      lVar10 = uVar11 + uVar12;
      uVar12 = uVar12 + 1;
      uVar11 = lVar10 + 1U & *(ulong *)(this + 8);
    } while (uVar12 <= *(ulong *)(this + 8));
    if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x20)) {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)this,pos0,hash,first);
    }
    else {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)this,hash,first);
    }
LAB_00543bce:
    first = first + 1;
  } while( true );
}

Assistant:

void insert(InputIterator first, InputIterator last) {
        for (auto pos = first; pos != last; ++pos) {
            table_.emplace(*pos);
        }
    }